

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseSimdConst
          (WastParser *this,Const *const_,Type in_type,int32_t nSimdConstBytes)

{
  uint uVar1;
  bool bVar2;
  Result RVar3;
  Literal *pLVar4;
  long lVar5;
  anon_union_16_5_a72a3a04_for_Const_2 *out;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Token local_d0;
  undefined1 auStack_80 [8];
  Location loc;
  Literal literal;
  
  if (in_type == I32) {
    GetLocation(&local_d0.loc,this);
    (const_->loc).field_1.field_1.offset = (size_t)local_d0.loc.field_1.field_1.offset;
    *(undefined8 *)((long)&(const_->loc).field_1 + 8) = local_d0.loc.field_1._8_8_;
    (const_->loc).filename.data_ = local_d0.loc.filename.data_;
    (const_->loc).filename.size_ = local_d0.loc.filename.size_;
    out = &const_->field_2;
    uVar1 = nSimdConstBytes >> 2;
    if (nSimdConstBytes >> 2 < 1) {
      uVar1 = 0;
    }
    lVar5 = (ulong)uVar1 + 1;
    do {
      lVar5 = lVar5 + -1;
      if (lVar5 == 0) {
        return (Result)Ok;
      }
      GetLocation((Location *)auStack_80,this);
      bVar2 = PeekMatch(this,Last_Literal);
      if (!bVar2) {
        std::__cxx11::string::string
                  ((string *)&local_d0,"an Nat literal",
                   (allocator *)(literal.text.field_2._M_local_buf + 0xe));
        __l._M_len = 1;
        __l._M_array = (iterator)&local_d0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&loc.field_1 + 8),__l,
                 (allocator_type *)(literal.text.field_2._M_local_buf + 0xf));
        RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&loc.field_1 + 8),"123");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&loc.field_1 + 8));
        std::__cxx11::string::~string((string *)&local_d0);
        return (Result)RVar3.enum_;
      }
      Consume(&local_d0,this);
      pLVar4 = Token::literal(&local_d0);
      Literal::Literal((Literal *)((long)&loc.field_1 + 8),pLVar4);
      Token::~Token(&local_d0);
      RVar3 = ParseInt32((char *)literal._0_8_,literal.text._M_dataplus._M_p + literal._0_8_,
                         &out->u32,SignedAndUnsigned);
      if (RVar3.enum_ == Error) {
        Error(this,0x101f28c,(char *)literal._0_8_);
      }
      out = (anon_union_16_5_a72a3a04_for_Const_2 *)((long)out + 4);
      std::__cxx11::string::~string((string *)&literal);
    } while (RVar3.enum_ != Error);
  }
  else {
    Error(this,0x101f2a1);
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseSimdConst(Const* const_,
                                  Type in_type,
                                  int32_t nSimdConstBytes) {
  WABT_TRACE(ParseSimdConst);

  // Parse the Simd Consts according to input data type.
  switch (in_type) {
    case Type::I32: {
      const_->loc = GetLocation();
      int Count = nSimdConstBytes / sizeof(uint32_t);
      // Meet expected "i32" token. start parse 4 i32 consts
      for (int i = 0; i < Count; i++) {
        Location loc = GetLocation();

        // Expected one 0xXXXXXXXX number
        if (!PeekMatch(TokenType::Nat))
          return ErrorExpected({"an Nat literal"}, "123");

        Literal literal = Consume().literal();

        string_view sv = literal.text;
        const char* s = sv.begin();
        const char* end = sv.end();
        Result result;

        result = ParseInt32(s, end, &(const_->v128_bits.v[i]),
                            ParseIntType::SignedAndUnsigned);

        if (Failed(result)) {
          Error(loc, "invalid literal \"%s\"", literal.text.c_str());
          return Result::Error;
        }
      }
      break;
    }

    default:
      Error(const_->loc, "Expected i32 at start of simd constant");
      return Result::Error;
  }

  return Result::Ok;
}